

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_settable(lua_State *L,int idx)

{
  StkId pTVar1;
  bool bVar2;
  undefined4 uVar3;
  TValue *t_00;
  TValue *local_28;
  TValue *slot;
  StkId t;
  int idx_local;
  lua_State *L_local;
  
  t_00 = index2addr(L,idx);
  if (t_00->tt_ == 0x45) {
    local_28 = luaH_get((Table *)(t_00->value_).gc,L->top + -2);
    if (local_28->tt_ == 0) {
      bVar2 = false;
    }
    else {
      if ((((L->top[-1].tt_ & 0x40U) != 0) && ((((t_00->value_).gc)->marked & 4) != 0)) &&
         (((L->top[-1].value_.gc)->marked & 3) != 0)) {
        luaC_barrierback_(L,(Table *)(t_00->value_).gc);
      }
      pTVar1 = L->top;
      local_28->value_ = pTVar1[-1].value_;
      uVar3 = *(undefined4 *)&pTVar1[-1].field_0xc;
      local_28->tt_ = pTVar1[-1].tt_;
      *(undefined4 *)&local_28->field_0xc = uVar3;
      bVar2 = true;
    }
    if (bVar2) goto LAB_00110393;
  }
  else {
    local_28 = (TValue *)0x0;
  }
  luaV_finishset(L,t_00,L->top + -2,L->top + -1,local_28);
LAB_00110393:
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_settable (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2addr(L, idx);
  luaV_settable(L, t, L->top - 2, L->top - 1);
  L->top -= 2;  /* pop index and value */
  lua_unlock(L);
}